

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

string * __thiscall
soul::convertToString_abi_cxx11_(string *__return_storage_ptr__,soul *this,IdentifierPath *name)

{
  string local_38;
  soul *local_18;
  IdentifierPath *name_local;
  
  local_18 = this;
  name_local = (IdentifierPath *)__return_storage_ptr__;
  IdentifierPath::toString_abi_cxx11_(&local_38,(IdentifierPath *)this);
  Program::stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string convertToString (const IdentifierPath& name)     { return Program::stripRootNamespaceFromQualifiedPath (name.toString()); }